

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluj.c
# Opt level: O0

int ffpssujj(fitsfile *fptr,long group,long naxis,long *naxes,long *fpixel,long *lpixel,
            ULONGLONG *array,int *status)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_R8;
  long in_R9;
  long irange [7];
  long i7;
  long i6;
  long i5;
  long i4;
  long i3;
  long i2;
  long i1;
  long ii;
  LONGLONG st7;
  LONGLONG st6;
  LONGLONG st5;
  LONGLONG st4;
  LONGLONG st3;
  LONGLONG st2;
  LONGLONG st1;
  LONGLONG st70;
  LONGLONG st60;
  LONGLONG st50;
  LONGLONG st40;
  LONGLONG st30;
  LONGLONG st20;
  LONGLONG st10;
  LONGLONG off7;
  LONGLONG off6;
  LONGLONG off5;
  LONGLONG off4;
  LONGLONG off3;
  LONGLONG off2;
  LONGLONG pstart;
  LONGLONG astart;
  LONGLONG dimen [7];
  LONGLONG fpix [7];
  long tablerow;
  ULONGLONG *in_stack_00007090;
  LONGLONG in_stack_00007098;
  LONGLONG in_stack_000070a0;
  LONGLONG in_stack_000070a8;
  int in_stack_000070b4;
  fitsfile *in_stack_000070b8;
  int *in_stack_00007100;
  fitsfile *in_stack_fffffffffffffe08;
  long local_1f0;
  long local_1e8 [8];
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8 [8];
  long local_78 [7];
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  int local_4;
  
  if (*(int *)irange[0] < 1) {
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    iVar1 = fits_is_compressed_image(in_stack_fffffffffffffe08,(int *)0x22a2df);
    if (iVar1 == 0) {
      if ((local_20 < 1) || (7 < local_20)) {
        *(undefined4 *)irange[0] = 0x140;
        local_4 = 0x140;
      }
      else {
        if (local_18 < 1) {
          local_1f0 = 1;
        }
        else {
          local_1f0 = local_18;
        }
        local_40 = local_1f0;
        for (local_170 = 0; local_170 < 7; local_170 = local_170 + 1) {
          local_78[local_170] = 1;
          local_1e8[local_170] = 1;
          local_b8[local_170] = 1;
        }
        for (local_170 = 0; local_170 < local_20; local_170 = local_170 + 1) {
          local_78[local_170] = *(long *)(local_30 + local_170 * 8);
          local_1e8[local_170] =
               (*(long *)(local_38 + local_170 * 8) - *(long *)(local_30 + local_170 * 8)) + 1;
          local_b8[local_170] = *(long *)(local_28 + local_170 * 8);
        }
        local_178 = local_1e8[0];
        local_d0 = local_b8[0];
        local_d8 = local_b8[0] * local_b8[1];
        local_e0 = local_d8 * local_b8[2];
        local_e8 = local_e0 * local_b8[3];
        local_f0 = local_e8 * local_b8[4];
        local_f8 = local_f0 * local_b8[5];
        local_100 = local_78[0];
        local_140 = (local_78[1] + -1) * local_b8[0];
        local_148 = (local_78[2] + -1) * local_d8;
        local_150 = (local_78[3] + -1) * local_e0;
        local_158 = (local_78[4] + -1) * local_e8;
        local_128 = (local_78[5] + -1) * local_f0;
        local_168 = (local_78[6] + -1) * local_f8;
        local_138 = local_78[0];
        local_c0 = 0;
        local_130 = local_168;
        local_120 = local_158;
        local_118 = local_150;
        local_110 = local_148;
        local_108 = local_140;
        for (local_1a8 = 0; local_1a8 < local_1e8[6]; local_1a8 = local_1a8 + 1) {
          local_160 = local_128;
          for (local_1a0 = 0; local_1a0 < local_1e8[5]; local_1a0 = local_1a0 + 1) {
            for (local_198 = 0; local_198 < local_1e8[4]; local_198 = local_198 + 1) {
              for (local_190 = 0; local_190 < local_1e8[3]; local_190 = local_190 + 1) {
                for (local_188 = 0; local_188 < local_1e8[2]; local_188 = local_188 + 1) {
                  local_c8 = local_138 + local_140 + local_148 + local_150 + local_158 + local_160 +
                             local_168;
                  for (local_180 = 0; local_180 < local_1e8[1]; local_180 = local_180 + 1) {
                    iVar1 = ffpclujj(in_stack_000070b8,in_stack_000070b4,in_stack_000070a8,
                                     in_stack_000070a0,in_stack_00007098,in_stack_00007090,
                                     in_stack_00007100);
                    if (0 < iVar1) {
                      return *(int *)irange[0];
                    }
                    local_c0 = local_178 + local_c0;
                    local_c8 = local_d0 + local_c8;
                  }
                  local_140 = local_108;
                  local_148 = local_148 + local_d8;
                }
                local_148 = local_110;
                local_150 = local_150 + local_e0;
              }
              local_150 = local_118;
              local_158 = local_158 + local_e8;
            }
            local_158 = local_120;
            local_160 = local_160 + local_f0;
          }
          local_168 = local_168 + local_f8;
        }
        local_4 = *(int *)irange[0];
      }
    }
    else {
      ffpmsg((char *)0x22a2f0);
      *(undefined4 *)irange[0] = 0x19d;
      local_4 = 0x19d;
    }
  }
  else {
    local_4 = *(int *)irange[0];
  }
  return local_4;
}

Assistant:

int ffpssujj(fitsfile *fptr,   /* I - FITS file pointer                     */
           long  group,      /* I - group to write(1 = 1st group)           */
           long  naxis,      /* I - number of data axes in array            */
           long  *naxes,     /* I - size of each FITS axis                  */
           long  *fpixel,    /* I - 1st pixel in each axis to write (1=1st) */
           long  *lpixel,    /* I - last pixel in each axis to write        */
           ULONGLONG *array,      /* I - array to be written                     */
           int  *status)     /* IO - error status                           */
/*
  Write a subsection of pixels to the primary array or image.
  A subsection is defined to be any contiguous rectangular
  array of pixels within the n-dimensional FITS data file.
  Data conversion and scaling will be performed if necessary 
  (e.g, if the datatype of the FITS array is not the same as
  the array being written).
*/
{
    long tablerow;
    LONGLONG fpix[7], dimen[7], astart, pstart;
    LONGLONG off2, off3, off4, off5, off6, off7;
    LONGLONG st10, st20, st30, st40, st50, st60, st70;
    LONGLONG st1, st2, st3, st4, st5, st6, st7;
    long ii, i1, i2, i3, i4, i5, i6, i7, irange[7];

    if (*status > 0)
        return(*status);

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        ffpmsg("writing TULONGLONG to compressed image is not supported");

        return(*status = DATA_COMPRESSION_ERR);
    }

    if (naxis < 1 || naxis > 7)
      return(*status = BAD_DIMEN);

    tablerow=maxvalue(1,group);

     /* calculate the size and number of loops to perform in each dimension */
    for (ii = 0; ii < 7; ii++)
    {
      fpix[ii]=1;
      irange[ii]=1;
      dimen[ii]=1;
    }

    for (ii = 0; ii < naxis; ii++)
    {    
      fpix[ii]=fpixel[ii];
      irange[ii]=lpixel[ii]-fpixel[ii]+1;
      dimen[ii]=naxes[ii];
    }

    i1=irange[0];

    /* compute the pixel offset between each dimension */
    off2 =     dimen[0];
    off3 = off2 * dimen[1];
    off4 = off3 * dimen[2];
    off5 = off4 * dimen[3];
    off6 = off5 * dimen[4];
    off7 = off6 * dimen[5];

    st10 = fpix[0];
    st20 = (fpix[1] - 1) * off2;
    st30 = (fpix[2] - 1) * off3;
    st40 = (fpix[3] - 1) * off4;
    st50 = (fpix[4] - 1) * off5;
    st60 = (fpix[5] - 1) * off6;
    st70 = (fpix[6] - 1) * off7;

    /* store the initial offset in each dimension */
    st1 = st10;
    st2 = st20;
    st3 = st30;
    st4 = st40;
    st5 = st50;
    st6 = st60;
    st7 = st70;

    astart = 0;

    for (i7 = 0; i7 < irange[6]; i7++)
    {
     for (i6 = 0; i6 < irange[5]; i6++)
     {
      for (i5 = 0; i5 < irange[4]; i5++)
      {
       for (i4 = 0; i4 < irange[3]; i4++)
       {
        for (i3 = 0; i3 < irange[2]; i3++)
        {
         pstart = st1 + st2 + st3 + st4 + st5 + st6 + st7;

         for (i2 = 0; i2 < irange[1]; i2++)
         {
           if (ffpclujj(fptr, 2, tablerow, pstart, i1, &array[astart],
              status) > 0)
              return(*status);

           astart += i1;
           pstart += off2;
         }
         st2 = st20;
         st3 = st3+off3;    
        }
        st3 = st30;
        st4 = st4+off4;
       }
       st4 = st40;
       st5 = st5+off5;
      }
      st5 = st50;
      st6 = st6+off6;
     }
     st6 = st60;
     st7 = st7+off7;
    }
    return(*status);
}